

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STGV.cpp
# Opt level: O0

void __thiscall STGV::visit(STGV *this,VarDecl *node)

{
  Class *this_00;
  Variable *this_01;
  mapped_type *ppCVar1;
  string *varName;
  Error *error;
  Variable *variable;
  VarDecl *node_local;
  STGV *this_local;
  
  this_01 = createVar(&node->super_ASTNode);
  Variable::setKind(this_01,VAR);
  ppCVar1 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
            ::at(&this->symbolTable->classes,&this->currentNamespace);
  this_00 = *ppCVar1;
  varName = Variable::getName_abi_cxx11_(this_01);
  Class::addVariable(this_00,varName,this_01);
  return;
}

Assistant:

void STGV::visit(VarDecl *node) {
    Variable *variable = createVar(node);
    variable->setKind(Enums::Kind::VAR);
    try { symbolTable->classes.at(currentNamespace)->addVariable(variable->getName(), variable); }
    catch (Semantic::Error &error) {
        detector->addError(error.what());
        return;
    }
}